

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUIButton::drawSprite
          (CGUIButton *this,EGUI_BUTTON_STATE state,u32 startTime,position2di *center)

{
  uint uVar1;
  IGUISpriteBank *pIVar2;
  u32 uVar3;
  undefined4 extraout_var;
  u32 local_48;
  u32 uStack_44;
  u32 uStack_40;
  u32 uStack_3c;
  
  uVar1 = this->ButtonSprites[state].Index;
  if (uVar1 != 0xffffffff) {
    if (this->ButtonSprites[state].Scale == true) {
      local_48 = this->ButtonSprites[state].Color.color;
      pIVar2 = this->SpriteBank;
      uStack_44 = local_48;
      uStack_40 = local_48;
      uStack_3c = local_48;
      uVar3 = os::Timer::getTime();
      (*pIVar2->_vptr_IGUISpriteBank[9])
                (pIVar2,(ulong)uVar1,&this->field_0x40,&this->field_0x50,&local_48,
                 (ulong)(uVar3 - startTime),(ulong)this->ButtonSprites[state].Loop);
    }
    else {
      pIVar2 = this->SpriteBank;
      uVar3 = os::Timer::getTime();
      (*pIVar2->_vptr_IGUISpriteBank[8])
                (pIVar2,(ulong)uVar1,center,&this->field_0x50,&this->ButtonSprites[state].Color,
                 (ulong)startTime,CONCAT44(extraout_var,uVar3),
                 (ulong)this->ButtonSprites[state].Loop,1);
    }
  }
  return;
}

Assistant:

void CGUIButton::drawSprite(EGUI_BUTTON_STATE state, u32 startTime, const core::position2di &center)
{
	u32 stateIdx = (u32)state;

	if (ButtonSprites[stateIdx].Index != -1) {
		if (ButtonSprites[stateIdx].Scale) {
			const video::SColor colors[] = {ButtonSprites[stateIdx].Color, ButtonSprites[stateIdx].Color, ButtonSprites[stateIdx].Color, ButtonSprites[stateIdx].Color};
			SpriteBank->draw2DSprite(ButtonSprites[stateIdx].Index, AbsoluteRect,
					&AbsoluteClippingRect, colors,
					os::Timer::getTime() - startTime, ButtonSprites[stateIdx].Loop);
		} else {
			SpriteBank->draw2DSprite(ButtonSprites[stateIdx].Index, center,
					&AbsoluteClippingRect, ButtonSprites[stateIdx].Color, startTime, os::Timer::getTime(),
					ButtonSprites[stateIdx].Loop, true);
		}
	}
}